

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O1

string * __thiscall
testing::internal::XmlUnitTestResultPrinter::TestPropertiesAsXmlAttributes_abi_cxx11_
          (string *__return_storage_ptr__,XmlUnitTestResultPrinter *this,TestResult *result)

{
  string *psVar1;
  TestProperty *pTVar2;
  size_t sVar3;
  char *__s;
  int i;
  stringstream *psVar4;
  Message attributes;
  allocator local_81;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  string *local_78;
  string local_70;
  string local_50;
  
  local_78 = __return_storage_ptr__;
  Message::Message((Message *)&local_80);
  if (0 < (int)((ulong)((long)this[2].output_file_._M_dataplus._M_p -
                       (long)this[2].super_EmptyTestEventListener.super_TestEventListener.
                             _vptr_TestEventListener) >> 6)) {
    psVar4 = local_80.ptr_ + 0x10;
    i = 0;
    do {
      pTVar2 = TestResult::GetTestProperty((TestResult *)this,i);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar4," ",1);
      __s = (pTVar2->key_)._M_dataplus._M_p;
      if (__s == (char *)0x0) {
        sVar3 = 6;
        __s = "(null)";
      }
      else {
        sVar3 = strlen(__s);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar4,__s,sVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar4,"=",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar4,"\"",1);
      std::__cxx11::string::string((string *)&local_50,(pTVar2->value_)._M_dataplus._M_p,&local_81);
      EscapeXml(&local_70,&local_50,true);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)psVar4,local_70._M_dataplus._M_p,local_70._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar4,"\"",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      i = i + 1;
    } while (i < (int)((ulong)((long)this[2].output_file_._M_dataplus._M_p -
                              (long)this[2].super_EmptyTestEventListener.super_TestEventListener.
                                    _vptr_TestEventListener) >> 6));
  }
  psVar1 = local_78;
  StringStreamToString(local_78,local_80.ptr_);
  if (local_80.ptr_ != (stringstream *)0x0) {
    (**(code **)(*(long *)local_80.ptr_ + 8))(local_80.ptr_);
  }
  return psVar1;
}

Assistant:

std::string XmlUnitTestResultPrinter::TestPropertiesAsXmlAttributes(
    const TestResult& result) {
  Message attributes;
  for (int i = 0; i < result.test_property_count(); ++i) {
    const TestProperty& property = result.GetTestProperty(i);
    attributes << " " << property.key() << "="
        << "\"" << EscapeXmlAttribute(property.value()) << "\"";
  }
  return attributes.GetString();
}